

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_compressContinue_internal
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,U32 frame,
                 U32 lastFrameChunk)

{
  ZSTD_matchState_t *window;
  unsigned_long_long uVar1;
  uint uVar2;
  U32 UVar3;
  U32 UVar4;
  uint uVar5;
  U32 reducerValue;
  U32 UVar7;
  size_t sVar8;
  size_t code;
  uint uVar9;
  long lVar10;
  ulong srcSize_00;
  ZSTD_CCtx_params *pZVar11;
  int *piVar12;
  undefined8 *puVar13;
  size_t sVar14;
  ulong uVar15;
  ZSTD_CCtx_params in_stack_ffffffffffffff08;
  int iVar6;
  
  if (cctx->stage == ZSTDcs_created) {
    code = 0xffffffffffffffc4;
  }
  else {
    if (cctx->stage == ZSTDcs_init && frame != 0) {
      uVar1 = cctx->pledgedSrcSizePlusOne;
      UVar3 = cctx->dictID;
      pZVar11 = &cctx->appliedParams;
      puVar13 = (undefined8 *)&stack0xffffffffffffff08;
      for (lVar10 = 0xf; lVar10 != 0; lVar10 = lVar10 + -1) {
        *puVar13 = *(undefined8 *)pZVar11;
        pZVar11 = (ZSTD_CCtx_params *)&(pZVar11->cParams).chainLog;
        puVar13 = puVar13 + 1;
      }
      sVar8 = ZSTD_writeFrameHeader(dst,dstCapacity,in_stack_ffffffffffffff08,uVar1 - 1,UVar3);
      uVar2 = ZSTD_isError(sVar8);
      if (uVar2 != 0) {
        return sVar8;
      }
      dstCapacity = dstCapacity - sVar8;
      dst = (void *)((long)dst + sVar8);
      cctx->stage = ZSTDcs_ongoing;
    }
    else {
      sVar8 = 0;
    }
    code = sVar8;
    if (srcSize != 0) {
      window = &(cctx->blockState).matchState;
      UVar3 = ZSTD_window_update(&window->window,src,srcSize);
      if (UVar3 == 0) {
        (cctx->blockState).matchState.nextToUpdate = (cctx->blockState).matchState.window.dictLimit;
      }
      if (0xe0000000 <
          (uint)(((int)srcSize + (int)src) - *(int *)&(cctx->blockState).matchState.window.base)) {
        UVar3 = ZSTD_window_correctOverflow
                          (&window->window,
                           ((cctx->appliedParams).cParams.chainLog - 1) +
                           (uint)((cctx->appliedParams).cParams.strategy < ZSTD_btlazy2),
                           (cctx->blockState).matchState.window.lowLimit,src);
        ZSTD_reduceIndex(cctx,UVar3);
        uVar2 = (cctx->blockState).matchState.nextToUpdate;
        UVar4 = uVar2 - UVar3;
        if (uVar2 < UVar3) {
          UVar4 = 0;
        }
        (cctx->blockState).matchState.nextToUpdate = UVar4;
        (cctx->blockState).matchState.loadedDictEnd = 0;
      }
      if ((cctx->appliedParams).ldmParams.enableLdm != 0) {
        ZSTD_window_update(&(cctx->ldmState).window,src,srcSize);
      }
      if (frame == 0) {
        code = ZSTD_compressBlock_internal(cctx,dst,dstCapacity,src,srcSize);
      }
      else {
        UVar3 = 1 << ((byte)(cctx->appliedParams).cParams.windowLog & 0x1f);
        srcSize_00 = cctx->blockSize;
        if ((cctx->appliedParams).fParams.checksumFlag != 0) {
          XXH64_update(&cctx->xxhState,src,srcSize);
        }
        piVar12 = (int *)dst;
        for (sVar14 = srcSize; sVar14 != 0; sVar14 = sVar14 - srcSize_00) {
          uVar2 = lastFrameChunk & 1;
          if (srcSize_00 < sVar14) {
            uVar2 = 0;
          }
          if (dstCapacity < 6) {
LAB_00146905:
            code = 0xffffffffffffffba;
            goto LAB_00146960;
          }
          if (sVar14 < srcSize_00) {
            srcSize_00 = sVar14;
          }
          iVar6 = (int)(void *)((long)src + srcSize_00);
          uVar5 = iVar6 - *(int *)&(cctx->blockState).matchState.window.base;
          if (uVar5 < 0xe0000001) {
            UVar4 = (cctx->blockState).matchState.loadedDictEnd;
          }
          else {
            reducerValue = ZSTD_window_correctOverflow
                                     (&window->window,
                                      ((cctx->appliedParams).cParams.chainLog - 1) +
                                      (uint)((cctx->appliedParams).cParams.strategy < ZSTD_btlazy2),
                                      UVar3,src);
            ZSTD_reduceIndex(cctx,reducerValue);
            uVar5 = (cctx->blockState).matchState.nextToUpdate;
            UVar4 = 0;
            UVar7 = uVar5 - reducerValue;
            if (uVar5 < reducerValue) {
              UVar7 = 0;
            }
            (cctx->blockState).matchState.nextToUpdate = UVar7;
            (cctx->blockState).matchState.loadedDictEnd = 0;
            uVar5 = iVar6 - *(int *)&(cctx->blockState).matchState.window.base;
          }
          uVar9 = (cctx->blockState).matchState.window.lowLimit;
          if (UVar4 + UVar3 < uVar5) {
            uVar5 = uVar5 - UVar3;
            if (uVar9 < uVar5) {
              (cctx->blockState).matchState.window.lowLimit = uVar5;
              uVar9 = uVar5;
            }
            if ((cctx->blockState).matchState.window.dictLimit < uVar9) {
              (cctx->blockState).matchState.window.dictLimit = uVar9;
            }
            (cctx->blockState).matchState.loadedDictEnd = 0;
          }
          if ((cctx->blockState).matchState.nextToUpdate < uVar9) {
            (cctx->blockState).matchState.nextToUpdate = uVar9;
          }
          code = ZSTD_compressBlock_internal
                           (cctx,(void *)((long)piVar12 + 3),dstCapacity - 3,src,srcSize_00);
          uVar5 = ZSTD_isError(code);
          if (uVar5 != 0) goto LAB_00146960;
          if (code == 0) {
            uVar15 = srcSize_00 + 3;
            if (dstCapacity < uVar15) goto LAB_00146905;
            *piVar12 = uVar2 + (int)srcSize_00 * 8;
            memcpy((void *)((long)piVar12 + 3),src,srcSize_00);
          }
          else {
            *(short *)piVar12 = (short)uVar2 + 4 + (short)code * 8;
            *(char *)((long)piVar12 + 2) = (char)(code >> 0xd);
            uVar15 = code + 3;
          }
          piVar12 = (int *)((long)piVar12 + uVar15);
          dstCapacity = dstCapacity - uVar15;
          src = (void *)((long)src + srcSize_00);
        }
        if ((lastFrameChunk != 0) && (dst < piVar12)) {
          cctx->stage = ZSTDcs_ending;
        }
        code = (long)piVar12 - (long)dst;
      }
LAB_00146960:
      uVar2 = ZSTD_isError(code);
      if (uVar2 == 0) {
        uVar1 = cctx->consumedSrcSize;
        cctx->consumedSrcSize = uVar1 + srcSize;
        sVar8 = code + sVar8;
        cctx->producedCSize = cctx->producedCSize + sVar8;
        code = 0xffffffffffffffb8;
        if (uVar1 + srcSize + 1 <= cctx->pledgedSrcSizePlusOne) {
          code = sVar8;
        }
        if (cctx->pledgedSrcSizePlusOne == 0) {
          code = sVar8;
        }
      }
    }
  }
  return code;
}

Assistant:

static size_t ZSTD_compressContinue_internal (ZSTD_CCtx* cctx,
                              void* dst, size_t dstCapacity,
                        const void* src, size_t srcSize,
                               U32 frame, U32 lastFrameChunk)
{
    ZSTD_matchState_t* ms = &cctx->blockState.matchState;
    size_t fhSize = 0;

    DEBUGLOG(5, "ZSTD_compressContinue_internal, stage: %u, srcSize: %u",
                cctx->stage, (U32)srcSize);
    if (cctx->stage==ZSTDcs_created) return ERROR(stage_wrong);   /* missing init (ZSTD_compressBegin) */

    if (frame && (cctx->stage==ZSTDcs_init)) {
        fhSize = ZSTD_writeFrameHeader(dst, dstCapacity, cctx->appliedParams,
                                       cctx->pledgedSrcSizePlusOne-1, cctx->dictID);
        if (ZSTD_isError(fhSize)) return fhSize;
        dstCapacity -= fhSize;
        dst = (char*)dst + fhSize;
        cctx->stage = ZSTDcs_ongoing;
    }

    if (!srcSize) return fhSize;  /* do not generate an empty block if no input */

    if (!ZSTD_window_update(&ms->window, src, srcSize)) {
        ms->nextToUpdate = ms->window.dictLimit;
    }

    // Added this: Fixes a crash after 4 GB of input data -cat
    if (ZSTD_window_needOverflowCorrection(ms->window, (char*)src + srcSize)) {
        U32 const cycleLog = ZSTD_cycleLog(cctx->appliedParams.cParams.chainLog, cctx->appliedParams.cParams.strategy);
        U32 const correction = ZSTD_window_correctOverflow(&ms->window, cycleLog, ms->window.lowLimit, (char*)src);
        ZSTD_STATIC_ASSERT(ZSTD_CHAINLOG_MAX <= 30);
        ZSTD_STATIC_ASSERT(ZSTD_WINDOWLOG_MAX_32 <= 30);
        ZSTD_STATIC_ASSERT(ZSTD_WINDOWLOG_MAX <= 31);

        ZSTD_reduceIndex(cctx, correction);
        if (ms->nextToUpdate < correction) ms->nextToUpdate = 0;
        else ms->nextToUpdate -= correction;
        ms->loadedDictEnd = 0;
    }

    if (cctx->appliedParams.ldmParams.enableLdm)
        ZSTD_window_update(&cctx->ldmState.window, src, srcSize);

    DEBUGLOG(5, "ZSTD_compressContinue_internal (blockSize=%u)", (U32)cctx->blockSize);
    {   size_t const cSize = frame ?
                             ZSTD_compress_frameChunk (cctx, dst, dstCapacity, src, srcSize, lastFrameChunk) :
                             ZSTD_compressBlock_internal (cctx, dst, dstCapacity, src, srcSize);
        if (ZSTD_isError(cSize)) return cSize;
        cctx->consumedSrcSize += srcSize;
        cctx->producedCSize += (cSize + fhSize);
        assert(!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0));
        if (cctx->pledgedSrcSizePlusOne != 0) {  /* control src size */
            ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN == (unsigned long long)-1);
            if (cctx->consumedSrcSize+1 > cctx->pledgedSrcSizePlusOne) {
                DEBUGLOG(4, "error : pledgedSrcSize = %u, while realSrcSize >= %u",
                    (U32)cctx->pledgedSrcSizePlusOne-1, (U32)cctx->consumedSrcSize);
                return ERROR(srcSize_wrong);
            }
        }
        return cSize + fhSize;
    }
}